

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# graphIO.cpp
# Opt level: O1

void __thiscall CGraphIO::~CGraphIO(CGraphIO *this)

{
  pointer piVar1;
  pointer pdVar2;
  
  this->_vptr_CGraphIO = (_func_int **)&PTR__CGraphIO_00140d80;
  piVar1 = (this->m_vi_Vertices).super__Vector_base<int,_std::allocator<int>_>._M_impl.
           super__Vector_impl_data._M_start;
  if ((this->m_vi_Vertices).super__Vector_base<int,_std::allocator<int>_>._M_impl.
      super__Vector_impl_data._M_finish != piVar1) {
    (this->m_vi_Vertices).super__Vector_base<int,_std::allocator<int>_>._M_impl.
    super__Vector_impl_data._M_finish = piVar1;
  }
  piVar1 = (this->m_vi_OrderedVertices).super__Vector_base<int,_std::allocator<int>_>._M_impl.
           super__Vector_impl_data._M_start;
  if ((this->m_vi_OrderedVertices).super__Vector_base<int,_std::allocator<int>_>._M_impl.
      super__Vector_impl_data._M_finish != piVar1) {
    (this->m_vi_OrderedVertices).super__Vector_base<int,_std::allocator<int>_>._M_impl.
    super__Vector_impl_data._M_finish = piVar1;
  }
  piVar1 = (this->m_vi_Edges).super__Vector_base<int,_std::allocator<int>_>._M_impl.
           super__Vector_impl_data._M_start;
  if ((this->m_vi_Edges).super__Vector_base<int,_std::allocator<int>_>._M_impl.
      super__Vector_impl_data._M_finish != piVar1) {
    (this->m_vi_Edges).super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data
    ._M_finish = piVar1;
  }
  pdVar2 = (this->m_vd_Values).super__Vector_base<double,_std::allocator<double>_>._M_impl.
           super__Vector_impl_data._M_start;
  if ((this->m_vd_Values).super__Vector_base<double,_std::allocator<double>_>._M_impl.
      super__Vector_impl_data._M_finish != pdVar2) {
    (this->m_vd_Values).super__Vector_base<double,_std::allocator<double>_>._M_impl.
    super__Vector_impl_data._M_finish = pdVar2;
  }
  if (pdVar2 != (pointer)0x0) {
    operator_delete(pdVar2);
  }
  piVar1 = (this->m_vi_Edges).super__Vector_base<int,_std::allocator<int>_>._M_impl.
           super__Vector_impl_data._M_start;
  if (piVar1 != (pointer)0x0) {
    operator_delete(piVar1);
  }
  piVar1 = (this->m_vi_OrderedVertices).super__Vector_base<int,_std::allocator<int>_>._M_impl.
           super__Vector_impl_data._M_start;
  if (piVar1 != (pointer)0x0) {
    operator_delete(piVar1);
  }
  piVar1 = (this->m_vi_Vertices).super__Vector_base<int,_std::allocator<int>_>._M_impl.
           super__Vector_impl_data._M_start;
  if (piVar1 != (pointer)0x0) {
    operator_delete(piVar1);
    return;
  }
  return;
}

Assistant:

CGraphIO::~CGraphIO()
{
	m_vi_Vertices.clear();
	m_vi_OrderedVertices.clear();
	m_vi_Edges.clear();
	m_vd_Values.clear();
}